

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_compress.c
# Opt level: O2

int compress_bidder_bid(archive_read_filter_bidder *self,archive_read_filter *filter)

{
  int iVar1;
  char *pcVar2;
  ssize_t avail;
  
  pcVar2 = (char *)__archive_read_filter_ahead(filter,2,&avail);
  iVar1 = 0;
  if ((pcVar2 != (char *)0x0) && (iVar1 = 0, *pcVar2 == '\x1f')) {
    iVar1 = (uint)(pcVar2[1] == -99) << 4;
  }
  return iVar1;
}

Assistant:

static int
compress_bidder_bid(struct archive_read_filter_bidder *self,
    struct archive_read_filter *filter)
{
	const unsigned char *buffer;
	ssize_t avail;
	int bits_checked;

	(void)self; /* UNUSED */

	buffer = __archive_read_filter_ahead(filter, 2, &avail);

	if (buffer == NULL)
		return (0);

	bits_checked = 0;
	if (buffer[0] != 0x1F || buffer[1] != 0x9D)
		return (0);
	bits_checked += 16;

	/*
	 * TODO: Verify more.
	 */

	return (bits_checked);
}